

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlResimulate(Fra_Man_t *p)

{
  Vec_Int_t *vImps;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_30;
  
  Fra_SmlAssignDist1(p->pSml,p->pPatWords);
  Fra_SmlSimulateOne(p->pSml);
  if ((p->pPars->fProve != 0) && (iVar1 = Fra_SmlCheckOutput(p), iVar1 != 0)) {
    return;
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  iVar1 = Fra_ClassesRefine(p->pCla);
  iVar2 = Fra_ClassesRefine1(p->pCla,1,(int *)0x0);
  iVar2 = iVar2 + iVar1;
  vImps = p->pCla->vImps;
  if (vImps != (Vec_Int_t *)0x0) {
    iVar1 = Fra_ImpRefineUsingCex(p,vImps);
    iVar2 = iVar2 + iVar1;
  }
  if (p->vOneHots != (Vec_Int_t *)0x0) {
    iVar1 = Fra_OneHotRefineUsingCex(p,p->vOneHots);
    iVar2 = iVar2 + iVar1;
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeRef = p->timeRef + lVar4 + lVar3;
  if ((p->pPars->nFramesK == 0) && (iVar2 < 1)) {
    puts("Error: A counter-example did not refine classes!");
  }
  return;
}

Assistant:

void Fra_SmlResimulate( Fra_Man_t * p )
{
    int nChanges;
    abctime clk;
    Fra_SmlAssignDist1( p->pSml, p->pPatWords );
    Fra_SmlSimulateOne( p->pSml );
//    if ( p->pPars->fPatScores )
//        Fra_CleanPatScores( p );
    if ( p->pPars->fProve && Fra_SmlCheckOutput(p) )
        return;
clk = Abc_Clock();
    nChanges = Fra_ClassesRefine( p->pCla );
    nChanges += Fra_ClassesRefine1( p->pCla, 1, NULL );
    if ( p->pCla->vImps )
        nChanges += Fra_ImpRefineUsingCex( p, p->pCla->vImps );
    if ( p->vOneHots )
        nChanges += Fra_OneHotRefineUsingCex( p, p->vOneHots );
p->timeRef += Abc_Clock() - clk;
    if ( !p->pPars->nFramesK && nChanges < 1 )
        printf( "Error: A counter-example did not refine classes!\n" );
//    assert( nChanges >= 1 );
//printf( "Refined classes = %5d.   Changes = %4d.\n", Vec_PtrSize(p->vClasses), nChanges );
}